

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O2

List __thiscall xt::list::cons(list *this,Object *o)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  List LVar1;
  __shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2> local_40;
  Object local_30;
  
  std::__shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,(__shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2> *)EMPTY);
  Object::Object(&local_30,o);
  cons(this,(List *)&local_40,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  LVar1.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  LVar1.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (List)LVar1.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

List cons(Object o) {
	return cons(EMPTY, o);
}